

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)30,(moira::Mode)0,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  StrWriter *this_00;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)0,_(moira::Size)1> dst;
  u32 src;
  StrWriter *in_stack_ffffffffffffffa8;
  UInt u;
  UInt in_stack_ffffffffffffffc0;
  Align align;
  Ea<(moira::Mode)0,_(moira::Size)1> local_34;
  u32 local_20;
  ushort local_1a;
  u32 *local_18;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = dasmRead<(moira::Size)1>(in_RDI,(u32 *)in_stack_ffffffffffffffa8);
  Op<(moira::Mode)0,(moira::Size)1>(&local_34,in_RDI,local_1a & 7,local_18);
  pSVar1 = StrWriter::operator<<(local_10);
  align.raw = (in_RDI->tab).raw;
  pSVar1 = StrWriter::operator<<(pSVar1,align);
  u.raw = (u32)((ulong)in_RDI >> 0x20);
  pSVar1 = StrWriter::operator<<(pSVar1,"#");
  UInt::UInt((UInt *)&stack0xffffffffffffffc0,local_20);
  this_00 = StrWriter::operator<<(in_stack_ffffffffffffffa8,u);
  StrWriter::operator<<(this_00,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffc0.raw),
             (Ea<(moira::Mode)0,_(moira::Size)1> *)pSVar1);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}